

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLNode * __thiscall tinyxml2::XMLNode::InsertEndChild(XMLNode *this,XMLNode *addThis)

{
  XMLNode *pXVar1;
  XMLNode **ppXVar2;
  
  if (addThis->_document == this->_document) {
    if (addThis->_parent == (XMLNode *)0x0) {
      (*addThis->_memPool->_vptr_MemPool[5])();
    }
    else {
      Unlink(addThis->_parent,addThis);
    }
    pXVar1 = this->_lastChild;
    ppXVar2 = &pXVar1->_next;
    if (pXVar1 == (XMLNode *)0x0) {
      ppXVar2 = &this->_firstChild;
    }
    *ppXVar2 = addThis;
    this->_lastChild = addThis;
    addThis->_prev = pXVar1;
    addThis->_next = (XMLNode *)0x0;
    addThis->_parent = this;
  }
  else {
    addThis = (XMLNode *)0x0;
  }
  return addThis;
}

Assistant:

XMLNode* XMLNode::InsertEndChild( XMLNode* addThis )
{
    TIXMLASSERT( addThis );
    if ( addThis->_document != _document ) {
        TIXMLASSERT( false );
        return 0;
    }
    InsertChildPreamble( addThis );

    if ( _lastChild ) {
        TIXMLASSERT( _firstChild );
        TIXMLASSERT( _lastChild->_next == 0 );
        _lastChild->_next = addThis;
        addThis->_prev = _lastChild;
        _lastChild = addThis;

        addThis->_next = 0;
    }
    else {
        TIXMLASSERT( _firstChild == 0 );
        _firstChild = _lastChild = addThis;

        addThis->_prev = 0;
        addThis->_next = 0;
    }
    addThis->_parent = this;
    return addThis;
}